

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O2

string * __thiscall
ShOpcodeFormatter::formatOpcode_abi_cxx11_
          (ShOpcodeFormatter *this,ShOpcodeData *opData,ShRegisterData *regData,
          ShImmediateData *immData)

{
  std::__cxx11::string::assign((char *)this);
  handleOpcodeName(this,opData);
  while ((this->buffer)._M_string_length < 0xb) {
    std::__cxx11::string::push_back((char)this);
  }
  handleOpcodeParameters(this,opData,regData,immData);
  return &this->buffer;
}

Assistant:

const std::string& ShOpcodeFormatter::formatOpcode(const ShOpcodeData& opData, const ShRegisterData& regData,
	const ShImmediateData& immData)
{
	buffer = "   ";
	handleOpcodeName(opData);

	while (buffer.size() < 11)
		buffer += ' ';

	handleOpcodeParameters(opData,regData,immData);
	return buffer;
}